

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void * sqlite3MemMalloc(int nByte)

{
  uint in_EDI;
  sqlite3_int64 *p;
  long *local_10;
  
  local_10 = (long *)malloc((long)(int)(in_EDI + 8));
  if (local_10 == (long *)0x0) {
    sqlite3_log(7,"failed to allocate %u bytes of memory",(ulong)in_EDI);
    local_10 = (long *)0x0;
  }
  else {
    *local_10 = (long)(int)in_EDI;
    local_10 = local_10 + 1;
  }
  return local_10;
}

Assistant:

static void *sqlite3MemMalloc(int nByte){
#ifdef SQLITE_MALLOCSIZE
  void *p;
  testcase( ROUND8(nByte)==nByte );
  p = SQLITE_MALLOC( nByte );
  if( p==0 ){
    testcase( sqlite3GlobalConfig.xLog!=0 );
    sqlite3_log(SQLITE_NOMEM, "failed to allocate %u bytes of memory", nByte);
  }
  return p;
#else
  sqlite3_int64 *p;
  assert( nByte>0 );
  testcase( ROUND8(nByte)!=nByte );
  p = SQLITE_MALLOC( nByte+8 );
  if( p ){
    p[0] = nByte;
    p++;
  }else{
    testcase( sqlite3GlobalConfig.xLog!=0 );
    sqlite3_log(SQLITE_NOMEM, "failed to allocate %u bytes of memory", nByte);
  }
  return (void *)p;
#endif
}